

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

string * __thiscall
t_netstd_generator::base_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this,t_base_type *tbase)

{
  t_base tVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  t_base tbase_00;
  string local_60;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  t_base_type *local_20;
  t_base_type *tbase_local;
  t_netstd_generator *this_local;
  
  local_20 = tbase;
  tbase_local = (t_base_type *)this;
  this_local = (t_netstd_generator *)__return_storage_ptr__;
  tVar1 = t_base_type::get_base(tbase);
  switch(tVar1) {
  case TYPE_VOID:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"void",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case TYPE_STRING:
    uVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[7])();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"string",&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"byte[]",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case TYPE_I8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"sbyte",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  case TYPE_I16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"short",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case TYPE_I32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    break;
  case TYPE_I64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"long",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    break;
  case TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"double",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    break;
  default:
    __return_storage_ptr___00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    tVar1 = t_base_type::get_base(local_20);
    t_base_type::t_base_name_abi_cxx11_(&local_60,(t_base_type *)(ulong)tVar1,tbase_00);
    std::operator+(__return_storage_ptr___00,"compiler error: no C# name for base type ",&local_60);
    __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                std::__cxx11::string::~string);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::base_type_name(t_base_type* tbase)
{
    switch (tbase->get_base())
    {
    case t_base_type::TYPE_VOID:
        return "void";
    case t_base_type::TYPE_STRING:
        if (tbase->is_binary())
        {
            return "byte[]";
        } else {
            return "string";
        }
    case t_base_type::TYPE_BOOL:
        return "bool";
    case t_base_type::TYPE_I8:
        return "sbyte";
    case t_base_type::TYPE_I16:
        return "short";
    case t_base_type::TYPE_I32:
        return "int";
    case t_base_type::TYPE_I64:
        return "long";
    case t_base_type::TYPE_DOUBLE:
        return "double";
    default:
        throw "compiler error: no C# name for base type " + t_base_type::t_base_name(tbase->get_base());
    }
}